

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvt2triphone.c
# Opt level: O1

word_posn_t btw_posn(char btw_mark,word_posn_t posn)

{
  word_posn_t wVar1;
  long ln;
  
  if (btw_mark == '\0') {
    wVar1 = WORD_POSN_INTERNAL;
    if (posn != WORD_POSN_BEGIN) {
      wVar1 = WORD_POSN_BEGIN;
      if ((WORD_POSN_SINGLE < posn) && (wVar1 = WORD_POSN_INTERNAL, posn != WORD_POSN_INTERNAL)) {
        ln = 0x7b;
        goto LAB_0011ad4c;
      }
    }
  }
  else {
    if (WORD_POSN_INTERNAL < posn) {
      ln = 0x6f;
LAB_0011ad4c:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
              ,ln,"Unhandled word position\n");
      exit(1);
    }
    wVar1 = *(word_posn_t *)(&DAT_00128624 + (ulong)posn * 4);
  }
  return wVar1;
}

Assistant:

word_posn_t btw_posn(char btw_mark,
		     word_posn_t posn)
{
    if (btw_mark) {
	if ((posn == WORD_POSN_INTERNAL) ||
	    (posn == WORD_POSN_BEGIN)) {
	    posn = WORD_POSN_END;
	}
	else if (posn == WORD_POSN_END) {
	    posn = WORD_POSN_SINGLE;
	}
	else if (posn == WORD_POSN_SINGLE)
	    ;	/* Don't change in this case */
	else {
	    E_FATAL("Unhandled word position\n");
	}
    }
    else {
	if (posn == WORD_POSN_BEGIN) {
	    posn = WORD_POSN_INTERNAL;
	} else if ((posn == WORD_POSN_END) ||
		   (posn == WORD_POSN_SINGLE)) {
	    posn = WORD_POSN_BEGIN;
	} else if (posn == WORD_POSN_INTERNAL)
	    ;	/* Don't change posn's value in this case */
	else {
	    E_FATAL("Unhandled word position\n");
	}
    }

    return posn;
}